

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# machine_implementation.cc
# Opt level: O3

bool testbench::machine::availability::is(char *name)

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  bool bVar5;
  
  if ((anonymous_namespace)::machines == (undefined8 *)0x0) {
    (anonymous_namespace)::machines = (undefined8 *)operator_new(0x30);
    *(anonymous_namespace)::machines = 0;
    (anonymous_namespace)::machines[1] = 0;
    (anonymous_namespace)::machines[2] = 0;
    (anonymous_namespace)::machines[3] = 0;
    (anonymous_namespace)::machines[2] = 0;
    (anonymous_namespace)::machines[3] = 0;
    (anonymous_namespace)::machines[4] = 0;
    (anonymous_namespace)::machines[5] = 0;
    puVar3 = (undefined8 *)0x0;
  }
  else {
    puVar3 = (undefined8 *)*(anonymous_namespace)::machines;
  }
  puVar1 = (undefined8 *)(anonymous_namespace)::machines[1];
  if (puVar3 == puVar1) {
    bVar5 = false;
  }
  else {
    do {
      puVar4 = puVar3 + 1;
      iVar2 = strcmp((char *)*puVar3,name);
      bVar5 = iVar2 == 0;
      if (bVar5) {
        return bVar5;
      }
      puVar3 = puVar4;
    } while (puVar4 != puVar1);
  }
  return bVar5;
}

Assistant:

bool machine::availability::is(const char *name)
{
    factory_init();
    for (auto current_name : machines->names) {
        if (strcmp(current_name, name) == 0) {
            return true;
        }
    }
    return false;
}